

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Wec_t * Gia_ManIsoStrashReduceInt(Gia_Man_t *p,Vec_Wec_t *vSupps,int fVerbose)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar7;
  void *__s;
  Gia_Man_t *p_01;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int *local_48;
  
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar7 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 10000;
  pVVar7->nSize = 0;
  local_48 = (int *)malloc(40000);
  pVVar7->pArray = local_48;
  uVar5 = Gia_ManCoSuppSizeMax(p,vSupps);
  iVar6 = 0x10;
  if (0xe < uVar5) {
    iVar6 = uVar5 + 1;
  }
  if ((iVar6 == 0) || (__s = malloc((long)iVar6 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)(int)(uVar5 + 1) << 2);
  }
  iVar6 = vSupps->nSize;
  if (0 < (long)iVar6) {
    piVar10 = &vSupps->pArray->nSize;
    uVar11 = 0;
    do {
      iVar2 = *piVar10;
      if (((long)iVar2 < 0) || ((int)uVar5 < iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)__s + (long)iVar2 * 4);
      *piVar1 = *piVar1 + 1;
      uVar11 = uVar11 + 1;
      piVar10 = piVar10 + 4;
    } while (uVar11 < (ulong)(long)iVar6);
  }
  Gia_ManFillValue(p);
  p_01 = Gia_ManStart(p->nObjs);
  p->pObjs->Value = 0;
  uVar13 = uVar5;
  if (0 < (int)uVar5) {
    do {
      pGVar8 = Gia_ManAppendObj(p_01);
      uVar11 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_01->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar8)) {
LAB_001f3701:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      if ((pGVar8 < p_01->pObjs) || (p_01->pObjs + p_01->nObjs <= pGVar8)) goto LAB_001f3701;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  Gia_ManHashAlloc(p_01);
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      iVar6 = pVVar9->pArray[lVar14];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vSupps->nSize <= lVar14) {
LAB_001f377d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar2 = *(int *)((long)&vSupps->pArray->nSize + lVar12);
      if (((long)iVar2 < 0) || ((int)uVar5 < iVar2)) {
LAB_001f375e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)__s + (long)iVar2 * 4) == 1) {
        pVVar9 = Vec_WecPushLevel(p_00);
LAB_001f3667:
        Vec_IntPush(pVVar9,(int)lVar14);
      }
      else {
        uVar13 = Gia_ManIsoStrashReduceOne
                           (p_01,p,p->pObjs + iVar6,
                            (Vec_Int_t *)((long)&vSupps->pArray->nCap + lVar12));
        Vec_IntFillExtra(pVVar7,uVar13 + 1,-1);
        if (((int)uVar13 < 0) || (pVVar7->nSize <= (int)uVar13)) goto LAB_001f375e;
        local_48 = pVVar7->pArray;
        uVar3 = local_48[uVar13];
        if ((ulong)uVar3 != 0xffffffff) {
          if (((int)uVar3 < 0) || (p_00->nSize <= (int)uVar3)) goto LAB_001f377d;
          pVVar9 = p_00->pArray + uVar3;
          goto LAB_001f3667;
        }
        local_48[uVar13] = p_00->nSize;
        pVVar9 = Vec_WecPushLevel(p_00);
        Vec_IntPush(pVVar9,(int)lVar14);
      }
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCos;
      lVar12 = lVar12 + 0x10;
    } while (lVar14 < pVVar9->nSize);
  }
  Gia_ManHashStop(p_01);
  Gia_ManStop(p_01);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (local_48 != (int *)0x0) {
    free(local_48);
  }
  free(pVVar7);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManIsoStrashReduceInt( Gia_Man_t * p, Vec_Wec_t * vSupps, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    Vec_Int_t * vSuppOne, * vMap = Vec_IntAlloc( 10000 );
    int i, iLit, nSuppMax = Gia_ManCoSuppSizeMax( p, vSupps );
    // count how many times each support size appears
    Vec_Int_t * vSizeCount = Vec_IntStart( nSuppMax + 1 );
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_IntAddToEntry( vSizeCount, Vec_IntSize(vSuppOne), 1 );
    // create array of unique outputs
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nSuppMax; i++ )
        Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( Vec_IntEntry(vSizeCount, Vec_IntSize(vSuppOne)) == 1 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        iLit = Gia_ManIsoStrashReduceOne( pNew, p, pObj, vSuppOne );
        Vec_IntFillExtra( vMap, iLit + 1, -1 );
        if ( Vec_IntEntry(vMap, iLit) == -1 )
        {
            Vec_IntWriteEntry( vMap, iLit, Vec_WecSize(vPosEquivs) );
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        Vec_IntPush( Vec_WecEntry(vPosEquivs, Vec_IntEntry(vMap, iLit)), i );
    }
    Gia_ManHashStop( pNew );
    Gia_ManStop( pNew );
    Vec_IntFree( vSizeCount );
    Vec_IntFree( vMap );
    return vPosEquivs;
}